

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclKernel.cpp
# Opt level: O3

void __thiscall
xmrig::OclKernel::enqueueNDRange
          (OclKernel *this,cl_command_queue queue,uint32_t work_dim,size_t *global_work_offset,
          size_t *global_work_size,size_t *param_5)

{
  cl_int ret;
  char *pcVar1;
  char *pcVar2;
  runtime_error *this_00;
  
  ret = OclLib::enqueueNDRangeKernel
                  (queue,this->m_kernel,work_dim,global_work_offset,global_work_size,param_5,0,
                   (cl_event *)0x0,(cl_event *)0x0);
  if (ret == 0) {
    return;
  }
  pcVar1 = ocl_tag();
  pcVar2 = OclError::toString(ret);
  Log::print(ERR,
             "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31mclEnqueueNDRangeKernel\x1b[0m\x1b[0;31m for kernel \x1b[0m\x1b[1;31m%s\x1b[0m"
             ,pcVar1,pcVar2,(this->m_name).m_data);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar1 = OclError::toString(ret);
  std::runtime_error::runtime_error(this_00,pcVar1);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void xmrig::OclKernel::enqueueNDRange(cl_command_queue queue, uint32_t work_dim, const size_t *global_work_offset, const size_t *global_work_size, const size_t *local_work_size)
{
    const cl_int ret = OclLib::enqueueNDRangeKernel(queue, m_kernel, work_dim, global_work_offset, global_work_size, local_work_size, 0, nullptr, nullptr);
    if (ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("clEnqueueNDRangeKernel") RED(" for kernel ") RED_BOLD("%s"),
                ocl_tag(), OclError::toString(ret), name().data());

        throw std::runtime_error(OclError::toString(ret));
    }
}